

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O1

filename_t * spdlog::details::os::dir_name(filename_t *__return_storage_ptr__,filename_t *path)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)path,0x1b21e4,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE filename_t dir_name(const filename_t &path)
{
    auto pos = path.find_last_of(folder_seps_filename);
    return pos != filename_t::npos ? path.substr(0, pos) : filename_t{};
}